

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O1

void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference
               (IfcExtrudedAreaSolid *as,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  pointer puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  pointer paVar2;
  pointer puVar3;
  uint pcount;
  shared_ptr<Assimp::IFC::TempMesh> meshtmp;
  TempMesh temp;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  uint local_10c;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_108;
  TempMesh *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  pointer local_c0;
  iterator local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  pointer local_98;
  pointer paStack_90;
  pointer local_88;
  TempMesh *local_80;
  IfcVector3 local_78;
  IfcVector3 local_60;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_48;
  
  if (as != (IfcExtrudedAreaSolid *)0x0) {
    local_e8 = (TempMesh *)operator_new(0x30);
    (local_e8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
              (&local_e0,local_e8);
    ProcessExtrudedAreaSolid(as,local_e8,conv,false);
    this._M_pi = local_e0._M_pi;
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
      }
    }
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (pointer)0x0;
    local_c0 = (pointer)0x0;
    local_b8._M_current = (uint *)local_e8;
    _Stack_b0._M_pi = local_e0._M_pi;
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
      }
    }
    local_98 = (pointer)0x0;
    paStack_90 = (pointer)0x0;
    local_a8 = (element_type *)0x0;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88 = (pointer)0x0;
    local_d8._0_8_ = as;
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::vector
              (&local_48,1,(value_type *)local_d8,(allocator_type *)&local_78);
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
    if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
    }
    if (_Stack_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_b0._M_pi);
    }
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator=
              (&result->mVerts,&first_operand->mVerts);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&result->mVertcnt,&first_operand->mVertcnt);
    local_b8._M_current = (uint *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._16_8_ = (pointer)0x0;
    local_c0 = (pointer)0x0;
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    puVar3 = (first_operand->mVertcnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (first_operand->mVertcnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_80 = result;
    if (puVar3 != puVar1) {
      paVar2 = (first_operand->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_10c = *puVar3;
        TempMesh::Clear((TempMesh *)local_d8);
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_d8,
                   local_d8._8_8_,paVar2,paVar2 + local_10c);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_current == _Stack_b0._M_pi)
        {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c0,local_b8,
                     &local_10c);
        }
        else {
          *local_b8._M_current = local_10c;
          local_b8._M_current = local_b8._M_current + 1;
        }
        TempMesh::ComputeLastPolygonNormal(&local_78,(TempMesh *)local_d8,false);
        if (1e-05 <= local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y) {
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_108.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          (local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->x = 1.0;
          (local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->y = 0.0;
          (local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->z = 0.0;
          local_60.x = 0.0;
          local_60.y = 1.0;
          local_60.z = 0.0;
          local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_108.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          GenerateOpenings(&local_48,&local_108,(TempMesh *)local_d8,false,true,&local_60);
          if (local_108.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_108.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          TempMesh::Append(local_80,(TempMesh *)local_d8);
          paVar2 = paVar2 + local_10c;
        }
        else {
          LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b0313);
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != puVar1);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b03e7);
    if (local_c0 != (pointer)0x0) {
      operator_delete(local_c0,(long)_Stack_b0._M_pi - (long)local_c0);
    }
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              (&local_48);
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
    return;
  }
  __assert_fail("as != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                ,0x2d3,
                "void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid *, TempMesh &, const TempMesh &, ConversionData &)"
               );
}

Assistant:

void ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid* as, TempMesh& result,
                                               const TempMesh& first_operand,
                                               ConversionData& conv)
{
    ai_assert(as != NULL);

    // This case is handled by reduction to an instance of the quadrify() algorithm.
    // Obviously, this won't work for arbitrarily complex cases. In fact, the first
    // operand should be near-planar. Luckily, this is usually the case in Ifc
    // buildings.

    std::shared_ptr<TempMesh> meshtmp = std::shared_ptr<TempMesh>(new TempMesh());
    ProcessExtrudedAreaSolid(*as,*meshtmp,conv,false);

    std::vector<TempOpening> openings(1, TempOpening(as,IfcVector3(0,0,0),meshtmp,std::shared_ptr<TempMesh>()));

    result = first_operand;

    TempMesh temp;

    std::vector<IfcVector3>::const_iterator vit = first_operand.mVerts.begin();
    for(unsigned int pcount : first_operand.mVertcnt) {
        temp.Clear();

        temp.mVerts.insert(temp.mVerts.end(), vit, vit + pcount);
        temp.mVertcnt.push_back(pcount);

        // The algorithms used to generate mesh geometry sometimes
        // spit out lines or other degenerates which must be
        // filtered to avoid running into assertions later on.

        // ComputePolygonNormal returns the Newell normal, so the
        // length of the normal is the area of the polygon.
        const IfcVector3& normal = temp.ComputeLastPolygonNormal(false);
        if (normal.SquareLength() < static_cast<IfcFloat>(1e-5)) {
            IFCImporter::LogWarn("skipping degenerate polygon (ProcessBooleanExtrudedAreaSolidDifference)");
            continue;
        }

        GenerateOpenings(openings, std::vector<IfcVector3>(1,IfcVector3(1,0,0)), temp, false, true);
        result.Append(temp);

        vit += pcount;
    }

    IFCImporter::LogDebug("generating CSG geometry by geometric difference to a solid (IfcExtrudedAreaSolid)");
}